

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_game_window(tgestate_t *state)

{
  byte bVar1;
  long lVar2;
  undefined1 *puVar3;
  byte *pbVar4;
  long in_RDI;
  uint8_t tmp;
  uint8_t iters;
  uint8_t y_iters_B;
  uint8_t prev;
  uint8_t *dst;
  uint8_t y_iters_A;
  uint16_t *offsets;
  uint8_t *src;
  uint8_t y;
  uint8_t *screen;
  char local_3b;
  char local_3a;
  byte local_39;
  byte *local_38;
  char local_29;
  uint16_t *local_28;
  byte *local_20;
  
  lVar2 = *(long *)(in_RDI + 0x18) + 0x30;
  if (*(char *)(in_RDI + 0x70d) == '\0') {
    local_20 = (byte *)(*(long *)(in_RDI + 0x7a0) + 1 + (long)(int)(uint)*(byte *)(in_RDI + 0x70c));
    local_28 = game_window_start_offsets;
    local_29 = -0x80;
    do {
      puVar3 = (undefined1 *)(lVar2 + (int)(uint)*local_28);
      *puVar3 = *local_20;
      puVar3[1] = local_20[1];
      puVar3[2] = local_20[2];
      puVar3[3] = local_20[3];
      puVar3[4] = local_20[4];
      puVar3[5] = local_20[5];
      puVar3[6] = local_20[6];
      puVar3[7] = local_20[7];
      puVar3[8] = local_20[8];
      puVar3[9] = local_20[9];
      puVar3[10] = local_20[10];
      puVar3[0xb] = local_20[0xb];
      puVar3[0xc] = local_20[0xc];
      puVar3[0xd] = local_20[0xd];
      puVar3[0xe] = local_20[0xe];
      puVar3[0xf] = local_20[0xf];
      puVar3[0x10] = local_20[0x10];
      puVar3[0x11] = local_20[0x11];
      puVar3[0x12] = local_20[0x12];
      puVar3[0x13] = local_20[0x13];
      puVar3[0x14] = local_20[0x14];
      puVar3[0x15] = local_20[0x15];
      puVar3[0x16] = local_20[0x16];
      local_20 = local_20 + 0x18;
      local_29 = local_29 + -1;
      local_28 = local_28 + 1;
    } while (local_29 != '\0');
  }
  else {
    pbVar4 = (byte *)(*(long *)(in_RDI + 0x7a0) + (long)(int)(uint)*(byte *)(in_RDI + 0x70c));
    local_20 = pbVar4 + 1;
    local_39 = *pbVar4;
    local_28 = game_window_start_offsets;
    local_3a = -0x80;
    do {
      local_3b = '\x17';
      local_38 = (byte *)(lVar2 + (int)(uint)*local_28);
      pbVar4 = local_20;
      do {
        local_20 = pbVar4;
        bVar1 = *local_20;
        pbVar4 = local_20 + 1;
        *local_38 = (byte)((int)(uint)*local_20 >> 4) | local_39 << 4;
        local_3b = local_3b + -1;
        local_39 = bVar1;
        local_38 = local_38 + 1;
      } while (local_3b != '\0');
      local_20 = local_20 + 2;
      local_39 = *pbVar4;
      local_3a = local_3a + -1;
      local_28 = local_28 + 1;
    } while (local_3a != '\0');
  }
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))
            (*(undefined8 *)(in_RDI + 0x18),&plot_game_window::dirty);
  return;
}

Assistant:

void plot_game_window(tgestate_t *state)
{
  uint8_t *const  screen = &state->speccy->screen.pixels[0];

  uint8_t         y;         /* was A */
  const uint8_t  *src;       /* was HL */
  const uint16_t *offsets;   /* was SP */
  uint8_t         y_iters_A; /* was A */
  uint8_t        *dst;       /* was DE */
  uint8_t         prev;      /* was A */
  uint8_t         y_iters_B; /* was B' */
  uint8_t         iters;     /* was B */
  uint8_t         tmp;       /* Conv: added for RRD macro */

  assert(state->game_window_offset.x == 0 * 24 ||
         state->game_window_offset.x == 2 * 24 ||
         state->game_window_offset.x == 4 * 24 ||
         state->game_window_offset.x == 6 * 24);

  y = state->game_window_offset.y; // might not be a Y value. seems to only ever be 0 or 255.
  assert(y == 0 || y == 255);
  if (y == 0)
  {
    src = &state->window_buf[1] + state->game_window_offset.x;
    ASSERT_WINDOW_BUF_PTR_VALID(src, 0);
    offsets = &game_window_start_offsets[0];
    y_iters_A = 128; /* iterations */
    do
    {
      dst = screen + *offsets++;
      ASSERT_SCREEN_PTR_VALID(dst);

      *dst++ = *src++; /* unrolled: 23 copies */
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      src++; // skip 24th
    }
    while (--y_iters_A);
  }
  else
  {
    src = &state->window_buf[0] + state->game_window_offset.x;
    ASSERT_WINDOW_BUF_PTR_VALID(src, 0);
    prev = *src++;
    offsets = &game_window_start_offsets[0];
    y_iters_B = 128; /* iterations */
    do
    {
      dst = screen + *offsets++;
      ASSERT_SCREEN_PTR_VALID(dst);

      /* Conv: Unrolling removed compared to original code which did 4 groups of 5 ops, then a final 3. */
      iters = 4 * 5 + 3; /* 23 iterations */
      do
      {
        /* Conv: Original code banks and shuffles registers to preserve stuff. This is simplified. */

        tmp = prev & 0x0F;
        prev = *src; // save pixel so we can use the bottom nibble next time around
        *dst++ = (*src++ >> 4) | (tmp << 4);
      }
      while (--iters);

      prev = *src++;
    }
    while (--y_iters_B);
  }

  {
    static const zxbox_t dirty = { 7*8, 6*8, 30*8, 22*8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}